

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::
         write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  significand_type sVar3;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar4;
  appender aVar5;
  byte *pbVar6;
  ulong uVar7;
  long lVar8;
  significand_type sVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  bool bVar16;
  char decimal_point;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_28_7_94dcc806 write;
  undefined1 local_c1 [5];
  undefined1 local_bc [4];
  float_specs local_b8;
  sign_t local_ac;
  digit_grouping<char> local_a8;
  char local_80;
  basic_format_specs<char> *local_78;
  anon_class_64_8_b997adb5 local_70;
  
  local_a8.sep_.grouping._M_dataplus._M_p._0_4_ = fp->significand;
  uVar11 = 0x1f;
  if (((uint)local_a8.sep_.grouping._M_dataplus._M_p | 1) != 0) {
    for (; ((uint)local_a8.sep_.grouping._M_dataplus._M_p | 1) >> uVar11 == 0; uVar11 = uVar11 - 1)
    {
    }
  }
  uVar7 = (ulong)(uint)local_a8.sep_.grouping._M_dataplus._M_p +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar11 * 8);
  local_bc = SUB84(uVar7 >> 0x20,0);
  local_b8._4_4_ = fspecs._4_4_;
  local_ac = (uint)local_b8._4_4_ >> 8 & 0xff;
  fVar1 = fspecs;
  if ((long)uVar7 < 0) goto LAB_00123dc0;
  bVar16 = local_ac != 0;
  local_c1[0] = '.';
  uVar11 = (uint)local_b8._4_4_ >> 0x11;
  local_b8 = fspecs;
  if ((uVar11 & 1) != 0) {
    local_c1[0] = decimal_point_impl<char>(loc);
  }
  lVar14 = (ulong)bVar16 + (uVar7 >> 0x20);
  uVar11 = fp->exponent;
  local_a8.sep_.grouping._M_dataplus._M_p._4_4_ = (int)local_bc + uVar11;
  sVar9 = local_b8.precision;
  if (local_b8._4_1_ == '\x01') {
LAB_00123a71:
    iVar13 = uVar11 + (int)local_bc + -1;
    if (((uint)local_b8._4_4_ >> 0x14 & 1) == 0) {
      uVar7 = 0;
      if (local_bc == (undefined1  [4])0x1) {
        local_c1[0] = '\0';
      }
    }
    else {
      uVar7 = 0;
      if (0 < (int)(sVar9 - (int)local_bc)) {
        uVar7 = (ulong)(sVar9 - (int)local_bc);
      }
      lVar14 = lVar14 + uVar7;
    }
    local_70.sign = (sign_t *)CONCAT44((uint)local_a8.sep_.grouping._M_dataplus._M_p,local_ac);
    local_70.significand._0_5_ = CONCAT14(local_c1[0],local_bc);
    local_70.significand_size =
         (int *)(CONCAT35(local_70.significand_size._5_3_,
                          CONCAT14((((uint)local_b8._4_4_ >> 0x10 & 1) == 0) << 5,(int)uVar7)) |
                0x4500000000);
    local_70.fp = (decimal_fp<float> *)CONCAT44(local_70.fp._4_4_,iVar13);
    if (specs->width < 1) {
      bVar4.container =
           (buffer<char> *)
           write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
           anon_class_28_7_94dcc806::operator()
                     ((anon_class_28_7_94dcc806 *)&local_70,
                      out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    else {
      if ((int)local_a8.sep_.grouping._M_dataplus._M_p._4_4_ < 1) {
        iVar13 = 1 - local_a8.sep_.grouping._M_dataplus._M_p._4_4_;
      }
      lVar8 = 2;
      if (99 < iVar13) {
        lVar8 = (ulong)(999 < iVar13) + 3;
      }
      sVar15 = lVar14 + lVar8 + (3 - (ulong)(local_c1[0] == '\0'));
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                     (out,specs,sVar15,sVar15,(anon_class_28_7_94dcc806 *)&local_70);
    }
  }
  else {
    if (((ulong)local_b8 & 0xff00000000) == 0) {
      sVar3 = 0x10;
      if (0 < (int)sVar9) {
        sVar3 = sVar9;
      }
      if (((int)local_a8.sep_.grouping._M_dataplus._M_p._4_4_ < -3) ||
         ((int)sVar3 < (int)local_a8.sep_.grouping._M_dataplus._M_p._4_4_)) goto LAB_00123a71;
    }
    if ((int)uVar11 < 0) {
      if ((int)local_a8.sep_.grouping._M_dataplus._M_p._4_4_ < 1) {
        sVar3 = -local_a8.sep_.grouping._M_dataplus._M_p._4_4_;
        local_a8.sep_.grouping._M_string_length._0_4_ = sVar3;
        if (SBORROW4(sVar9,sVar3) !=
            (int)(sVar9 + local_a8.sep_.grouping._M_dataplus._M_p._4_4_) < 0) {
          local_a8.sep_.grouping._M_string_length._0_4_ = sVar9;
        }
        if ((int)sVar9 < 0) {
          local_a8.sep_.grouping._M_string_length._0_4_ = sVar3;
        }
        if (local_bc != (undefined1  [4])0x0) {
          local_a8.sep_.grouping._M_string_length._0_4_ = sVar3;
        }
        bVar2 = 1;
        if (local_bc == (undefined1  [4])0x0 &&
            (significand_type)local_a8.sep_.grouping._M_string_length == 0) {
          bVar2 = (local_b8._6_1_ & 0x10) >> 4;
        }
        local_c1[1] = bVar2;
        fVar1 = local_b8;
        if (-1 < (int)(significand_type)local_a8.sep_.grouping._M_string_length) {
          sVar15 = lVar14 + (ulong)(bVar2 + (significand_type)
                                            local_a8.sep_.grouping._M_string_length + 1);
          local_70.sign = (sign_t *)(local_c1 + 0x15);
          local_70.significand = (significand_type *)(local_c1 + 1);
          local_70.significand_size = (int *)local_c1;
          local_70.fp = (decimal_fp<float> *)((long)&local_a8 + 8);
          local_70.grouping = (digit_grouping<char> *)(local_c1 + 0x19);
          local_70.fspecs = (float_specs *)(local_c1 + 5);
          aVar5 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_&>
                            (out,specs,sVar15,sVar15,(anon_class_48_6_d9b5e731 *)&local_70);
          return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
                 aVar5.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
        }
LAB_00123dc0:
        local_b8 = fVar1;
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/core.h"
                    ,0x182,"negative value");
      }
      iVar13 = 0;
      local_c1._1_4_ = sVar9 - (int)local_bc & (int)(local_b8._4_4_ << 0xb) >> 0x1f;
      uVar11 = local_c1._1_4_;
      if ((int)local_c1._1_4_ < 1) {
        uVar11 = 0;
      }
      local_78 = specs;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)((long)&local_a8 + 8U),loc,
                 (bool)((byte)((uint)local_b8._4_4_ >> 0x11) & 1));
      pbVar6 = (byte *)CONCAT44(local_a8.sep_.grouping._M_string_length._4_4_,
                                (significand_type)local_a8.sep_.grouping._M_string_length);
      pbVar10 = pbVar6 + local_a8.sep_.grouping.field_2._M_allocated_capacity;
      sVar15 = (ulong)uVar11 + (uVar7 >> 0x20) + (ulong)bVar16;
      do {
        iVar12 = 0x7fffffff;
        if (local_80 != '\0') {
          if (pbVar6 == pbVar10) {
            uVar11 = (uint)(char)pbVar10[-1];
          }
          else {
            bVar2 = *pbVar6;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00123ca4;
            pbVar6 = pbVar6 + 1;
            uVar11 = (uint)bVar2;
          }
          iVar13 = iVar13 + uVar11;
          iVar12 = iVar13;
        }
LAB_00123ca4:
        sVar15 = sVar15 + 1;
      } while (iVar12 < (int)local_bc);
      local_70.sign = (sign_t *)(local_c1 + 0x15);
      local_70.significand = (significand_type *)(local_c1 + 0x19);
      local_70.significand_size = (int *)(local_c1 + 5);
      local_70.fp = (decimal_fp<float> *)((long)&local_a8 + 4);
      local_70.grouping = (digit_grouping<char> *)local_c1;
      local_70.decimal_point = local_c1 + 1;
      local_70.fspecs = (float_specs *)((long)&local_a8 + 8U);
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_&>
                     (out,local_78,sVar15,sVar15,(anon_class_56_7_aadf885c *)&local_70);
    }
    else {
      lVar14 = lVar14 + (ulong)uVar11;
      local_c1._1_4_ = sVar9 - local_a8.sep_.grouping._M_dataplus._M_p._4_4_;
      if (((uint)local_b8._4_4_ >> 0x14 & 1) != 0) {
        if (local_b8._4_1_ != '\x02' && (int)local_c1._1_4_ < 1) {
          local_c1._1_4_ = 1;
        }
        if (0 < (int)local_c1._1_4_) {
          lVar14 = lVar14 + (ulong)(uint)local_c1._1_4_ + 1;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)((long)&local_a8 + 8U),loc,
                 (bool)((byte)((uint)local_b8._4_4_ >> 0x11) & 1));
      pbVar6 = (byte *)CONCAT44(local_a8.sep_.grouping._M_string_length._4_4_,
                                (significand_type)local_a8.sep_.grouping._M_string_length);
      pbVar10 = pbVar6 + local_a8.sep_.grouping.field_2._M_allocated_capacity;
      sVar15 = lVar14 - 1;
      iVar13 = 0;
      do {
        iVar12 = 0x7fffffff;
        if (local_80 != '\0') {
          if (pbVar6 == pbVar10) {
            uVar11 = (uint)(char)pbVar10[-1];
          }
          else {
            bVar2 = *pbVar6;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_00123ba2;
            pbVar6 = pbVar6 + 1;
            uVar11 = (uint)bVar2;
          }
          iVar13 = iVar13 + uVar11;
          iVar12 = iVar13;
        }
LAB_00123ba2:
        sVar15 = sVar15 + 1;
      } while (iVar12 < (int)local_bc);
      local_70.sign = (sign_t *)(local_c1 + 0x15);
      local_70.significand = (significand_type *)(local_c1 + 0x19);
      local_70.significand_size = (int *)(local_c1 + 5);
      local_70.fspecs = (float_specs *)(local_c1 + 9);
      local_70.decimal_point = local_c1;
      local_70.num_zeros = (int *)(local_c1 + 1);
      local_70.fp = fp;
      local_70.grouping = (digit_grouping<char> *)((long)&local_a8 + 8U);
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_&>
                     (out,specs,sVar15,sVar15,&local_70);
    }
    if ((void *)CONCAT44(local_a8.sep_.grouping._M_string_length._4_4_,
                         (significand_type)local_a8.sep_.grouping._M_string_length) !=
        (void *)((long)&local_a8 + 0x18U)) {
      operator_delete((void *)CONCAT44(local_a8.sep_.grouping._M_string_length._4_4_,
                                       (significand_type)local_a8.sep_.grouping._M_string_length),
                      local_a8.sep_.grouping.field_2._8_8_ + 1);
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar4.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 locale_ref loc) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = digit_grouping<Char>(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = digit_grouping<Char>(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}